

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_remove_all(REF_GEOM ref_geom,REF_INT node)

{
  REF_ADJ pRVar1;
  int iVar2;
  uint uVar3;
  
  pRVar1 = ref_geom->ref_adj;
  while( true ) {
    iVar2 = -1;
    if ((-1 < node) && (iVar2 = -1, node < pRVar1->nnode)) {
      iVar2 = pRVar1->first[(uint)node];
    }
    if (iVar2 == -1) break;
    uVar3 = ref_geom_remove(ref_geom,pRVar1->item[iVar2].ref);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x247,
             "ref_geom_remove_all",(ulong)uVar3,"remove");
      return uVar3;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_remove_all(REF_GEOM ref_geom, REF_INT node) {
  REF_ADJ ref_adj = ref_geom_adj(ref_geom);
  REF_INT item, geom;

  item = ref_adj_first(ref_adj, node);
  while (ref_adj_valid(item)) {
    geom = ref_adj_item_ref(ref_adj, item);

    RSS(ref_geom_remove(ref_geom, geom), "remove");

    item = ref_adj_first(ref_adj, node);
  }

  return REF_SUCCESS;
}